

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

char * __thiscall
Memory::LargeHeapBlock::AllocFreeListEntry
          (LargeHeapBlock *this,size_t size,ObjectInfoBits attributes,
          LargeHeapBlockFreeListEntry *entry)

{
  uint uVar1;
  size_t size_00;
  HeapInfo *pHVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  LargeObjectHeader **ppLVar7;
  LargeHeapBlockFreeListEntry *this_00;
  LargeHeapBlockFreeListEntry *pLVar8;
  ConfigFlagsTable *pCVar9;
  HeapInfo *heapInfo;
  char *originalAllocEnd;
  char *newAllocAddressEnd;
  char *allocObject;
  LargeObjectHeader *header;
  size_t originalSize;
  uint headerIndex;
  LargeHeapBlockFreeListEntry *entry_local;
  ObjectInfoBits attributes_local;
  size_t size_local;
  LargeHeapBlock *this_local;
  
  if ((attributes & InternalObjectInfoBitMask) != attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x204,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  BVar5 = HeapInfo::IsAlignedSize(size);
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x205,"(HeapInfo::IsAlignedSize(size))","HeapInfo::IsAlignedSize(size)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((attributes & TrackBit) != NoBit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x209,"((attributes & TrackBit) == 0)",
                       "Large tracked object collection not implemented");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (entry->heapBlock != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x20b,"(entry->heapBlock == this)","entry->heapBlock == this");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (this->objectCount <= entry->headerIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x20c,"(entry->headerIndex < this->objectCount)",
                       "entry->headerIndex < this->objectCount");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ppLVar7 = HeaderList(this);
  if (ppLVar7[entry->headerIndex] != (LargeObjectHeader *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x20d,"(this->HeaderList()[entry->headerIndex] == nullptr)",
                       "this->HeaderList()[entry->headerIndex] == nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar1 = entry->headerIndex;
  size_00 = entry->objectSize;
  this_00 = entry + 1;
  pLVar8 = (LargeHeapBlockFreeListEntry *)
           ((long)&(((FinalizableObject *)&this_00->headerIndex)->super_IRecyclerVisitedObject).
                   _vptr_IRecyclerVisitedObject + size);
  if ((((LargeHeapBlockFreeListEntry *)this->addressEnd < pLVar8) || (pLVar8 < this_00)) ||
     ((LargeHeapBlockFreeListEntry *)
      ((long)&(((FinalizableObject *)&this_00->headerIndex)->super_IRecyclerVisitedObject).
              _vptr_IRecyclerVisitedObject + size_00) < pLVar8)) {
    return (char *)0x0;
  }
  BVar5 = Recycler::VerifyEnabled(this->heapInfo->recycler);
  if (BVar5 != 0) {
    Recycler::VerifyCheckFill(this_00,size_00);
  }
  memset(entry,0,size_00 + 0x20);
  BVar5 = Recycler::VerifyEnabled(this->heapInfo->recycler);
  if (BVar5 != 0) {
    memset(this_00,0xca,size_00);
  }
  pCVar9 = Recycler::GetRecyclerFlagsTable(this->heapInfo->recycler);
  if ((pCVar9->Verbose & 1U) != 0) {
    pCVar9 = Recycler::GetRecyclerFlagsTable(this->heapInfo->recycler);
    bVar4 = Js::Phases::IsEnabled(&pCVar9->Trace,MemoryAllocationPhase);
    if (!bVar4) {
      pCVar9 = Recycler::GetRecyclerFlagsTable(this->heapInfo->recycler);
      bVar4 = Js::Phases::IsEnabled(&pCVar9->Trace,LargeMemoryAllocationPhase);
      if (!bVar4) goto LAB_00962689;
    }
    Output::Print(L"Allocated object of size 0x%x in from free list entry at address 0x%p\n",size,
                  this_00);
  }
LAB_00962689:
  if (this->objectCount < this->allocCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x232,"(allocCount <= objectCount)","allocCount <= objectCount");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  entry->headerIndex = uVar1;
  entry->objectSize = size_00;
  *(byte *)((long)&entry->next + 2) =
       *(byte *)((long)&entry->next + 2) & 0xfd |
       ((attributes & WithBarrierBit) == WithBarrierBit) << 1;
  if ((attributes & (FinalizeBit|TrackBit)) != NoBit) {
    memset(this_00,0,8);
    DummyVTableObject::DummyVTableObject((DummyVTableObject *)this_00);
  }
  LargeObjectHeader::SetAttributes
            ((LargeObjectHeader *)entry,this->heapInfo->recycler->Cookie,(uchar)attributes);
  *(byte *)((long)&entry->next + 2) = *(byte *)((long)&entry->next + 2) & 0xfe;
  LargeObjectHeader::SetNext
            ((LargeObjectHeader *)entry,this->heapInfo->recycler->Cookie,(LargeObjectHeader *)0x0);
  ppLVar7 = HeaderList(this);
  ppLVar7[uVar1] = (LargeObjectHeader *)entry;
  this->finalizeCount = (uint)((attributes & FinalizeBit) != NoBit) + this->finalizeCount;
  if ((attributes & FinalizeBit) != NoBit) {
    pHVar2 = this->heapInfo;
    pHVar2->liveFinalizableObjectCount = pHVar2->liveFinalizableObjectCount + 1;
    pHVar2->newFinalizableObjectCount = pHVar2->newFinalizableObjectCount + 1;
  }
  return (char *)this_00;
}

Assistant:

char*
LargeHeapBlock::AllocFreeListEntry(DECLSPEC_GUARD_OVERFLOW size_t size, ObjectInfoBits attributes, LargeHeapBlockFreeListEntry* entry)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);
    Assert(HeapInfo::IsAlignedSize(size));
#ifdef RECYCLER_VISITED_HOST
    AssertMsg((attributes & TrackBit) == 0 || (attributes & RecyclerVisitedHostBit), "Large tracked object implemented just for recycler visited objects");
#else
    AssertMsg((attributes & TrackBit) == 0, "Large tracked object collection not implemented");
#endif
    Assert(entry->heapBlock == this);
    Assert(entry->headerIndex < this->objectCount);
    Assert(this->HeaderList()[entry->headerIndex] == nullptr);

    uint headerIndex = entry->headerIndex;
    size_t originalSize = entry->objectSize;

    LargeObjectHeader * header = (LargeObjectHeader *) entry;

    char * allocObject = ((char*) entry) + sizeof(LargeObjectHeader);       // shouldn't overflow
    char * newAllocAddressEnd = allocObject + size;
    char * originalAllocEnd = allocObject + originalSize;
    if (newAllocAddressEnd > addressEnd || newAllocAddressEnd < allocObject || (originalAllocEnd < newAllocAddressEnd))
    {
        return nullptr;
    }

#ifdef RECYCLER_MEMORY_VERIFY
    if (this->heapInfo->recycler->VerifyEnabled())
    {
        this->heapInfo->recycler->VerifyCheckFill(allocObject , originalSize);
    }
#endif

    memset(entry, 0, sizeof(LargeObjectHeader) + originalSize);

#ifdef RECYCLER_MEMORY_VERIFY
    // If we're in recyclerVerify mode, fill the non-header part of the allocation
    // with the verification pattern
    if (this->heapInfo->recycler->VerifyEnabled())
    {
        memset(allocObject, Recycler::VerifyMemFill, originalSize);
    }
#endif

#if DBG
    LargeAllocationVerboseTrace(this->heapInfo->recycler->GetRecyclerFlagsTable(), _u("Allocated object of size 0x%x in from free list entry at address 0x%p\n"), size, allocObject);
#endif

    Assert(allocCount <= objectCount);

    header->objectIndex = headerIndex;
    header->objectSize = originalSize;
#ifdef RECYCLER_WRITE_BARRIER
    header->hasWriteBarrier = (attributes & WithBarrierBit) == WithBarrierBit;
#endif

    if ((attributes & (FinalizeBit | TrackBit)) != 0)
    {
        // Make sure a valid vtable is installed as once the attributes have been set this allocation may be traced by background marking
        allocObject = (char *)new (allocObject) DummyVTableObject();
#if defined(_M_ARM32_OR_ARM64)
        // On ARM, make sure the v-table write is performed before setting the attributes
        MemoryBarrier();
#endif
    }
    header->SetAttributes(this->heapInfo->recycler->Cookie, (attributes & StoredObjectInfoBitMask));
    header->markOnOOMRescan = false;
    header->SetNext(this->heapInfo->recycler->Cookie, nullptr);

    HeaderList()[headerIndex] = header;
    finalizeCount += ((attributes & FinalizeBit) != 0);

#ifdef RECYCLER_FINALIZE_CHECK
    if (attributes & FinalizeBit)
    {
        HeapInfo * heapInfo = this->heapInfo;
        heapInfo->liveFinalizableObjectCount++;
        heapInfo->newFinalizableObjectCount++;
    }
#endif

    return allocObject;
}